

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ot::commissioner::coap::OptionType>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
           *__return_storage_ptr__,v10 *this,OptionType *args)

{
  OptionType *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}